

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseGTMCoverage::ParseMCOVLine
          (cmParseGTMCoverage *this,string *line,string *routine,string *function,int *linenumber,
          int *count)

{
  cmCTest *this_00;
  string *psVar1;
  cmParseGTMCoverage *pcVar2;
  string *psVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  char cVar8;
  bool bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string arg;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string *local_208;
  cmParseGTMCoverage *local_200;
  value_type local_1f8;
  int *local_1d8;
  string *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar9 = false;
  cVar8 = (char)line;
  local_1d8 = linenumber;
  local_1d0 = routine;
  lVar6 = std::__cxx11::string::find(cVar8,0x28);
  if (lVar6 != -1) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    bVar4 = (line->_M_dataplus)._M_p[lVar6];
    local_208 = function;
    local_200 = this;
    if (bVar4 != 0) {
      do {
        lVar6 = lVar6 + 1;
        bVar9 = bVar4 == 0x29;
        if (bVar4 < 0x29) {
          bVar9 = false;
          if ((bVar4 != 0x22) && (bVar9 = false, bVar4 != 0x28)) {
LAB_00561a09:
            bVar9 = false;
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
          }
        }
        else {
          if ((bVar4 != 0x2c) && (bVar4 != 0x29)) goto LAB_00561a09;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_228,&local_1f8);
          local_1f8._M_string_length = 0;
          *local_1f8._M_dataplus._M_p = '\0';
        }
        bVar4 = (line->_M_dataplus)._M_p[lVar6];
      } while ((bVar4 != 0) && (!bVar9));
    }
    bVar9 = false;
    lVar6 = std::__cxx11::string::find(cVar8,0x3d);
    if (lVar6 != -1) {
      if ((line->_M_dataplus)._M_p[lVar6 + 1] == '\"') {
        std::__cxx11::string::find(cVar8,0x3a);
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)line);
      }
      else {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)line);
      }
      iVar5 = atoi((char *)local_1a8._0_8_);
      psVar1 = local_208;
      *count = iVar5;
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      psVar3 = local_1d0;
      pcVar2 = local_200;
      if ((ulong)((long)local_228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error parsing mcov line: [",0x1a);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(line->_M_dataplus)._M_p,line->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
        this_00 = (pcVar2->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                     ,0xe9,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar9 = false;
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_1d0);
        std::__cxx11::string::_M_assign((string *)psVar1);
        if ((long)local_228.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_228.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x40) {
          psVar3->_M_string_length = 0;
          *(psVar3->_M_dataplus)._M_p = '\0';
          psVar1->_M_string_length = 0;
          *(psVar1->_M_dataplus)._M_p = '\0';
        }
        else {
          iVar5 = atoi(local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
          *local_1d8 = iVar5;
        }
        bVar9 = true;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return bVar9;
}

Assistant:

bool cmParseGTMCoverage::ParseMCOVLine(std::string const& line,
                                       std::string& routine,
                                       std::string& function, int& linenumber,
                                       int& count)
{
  // this method parses lines from the .mcov file
  // each line has ^COVERAGE(...) in it, and there
  // are several variants of coverage lines:
  //
  // ^COVERAGE("DIC11","PR1",0)="2:0:0:0"
  //          ( file  , entry, line ) = "number_executed:timing_info"
  // ^COVERAGE("%RSEL","SRC")="1:0:0:0"
  //          ( file  , entry ) = "number_executed:timing_info"
  // ^COVERAGE("%RSEL","init",8,"FOR_LOOP",1)=1
  //          ( file  , entry, line, IGNORE ) =number_executed
  std::vector<std::string> args;
  std::string::size_type pos = line.find('(', 0);
  // if no ( is found, then return line has no coverage
  if (pos == std::string::npos) {
    return false;
  }
  std::string arg;
  bool done = false;
  // separate out all of the comma separated arguments found
  // in the COVERAGE(...) line
  while (line[pos] && !done) {
    // save the char we are looking at
    char cur = line[pos];
    // , or ) means end of argument
    if (cur == ',' || cur == ')') {
      // save the argument into the argument vector
      args.push_back(arg);
      // start on a new argument
      arg.clear();
      // if we are at the end of the ), then finish while loop
      if (cur == ')') {
        done = true;
      }
    } else {
      // all chars except " and ( get stored in the arg string
      if (cur != '\"' && cur != '(') {
        arg.append(1, line[pos]);
      }
    }
    // move to next char
    pos++;
  }
  // now parse the right hand side of the =
  pos = line.find('=');
  // no = found, this is an error
  if (pos == std::string::npos) {
    return false;
  }
  pos++; // move past =

  // if the next positing is not a ", then this is a
  // COVERAGE(..)=count line and turn the rest of the string
  // past the = into an integer and set it to count
  if (line[pos] != '\"') {
    count = atoi(line.substr(pos).c_str());
  } else {
    // this means line[pos] is a ", and we have a
    // COVERAGE(...)="1:0:0:0" type of line
    pos++; // move past "
    // find the first : past the "
    std::string::size_type pos2 = line.find(':', pos);
    // turn the string between the " and the first : into an integer
    // and set it to count
    count = atoi(line.substr(pos, pos2 - pos).c_str());
  }
  // less then two arguments is an error
  if (args.size() < 2) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing mcov line: [" << line << "]\n");
    return false;
  }
  routine = args[0];  // the routine is the first argument
  function = args[1]; // the function in the routine is the second
  // in the two argument only format
  // ^COVERAGE("%RSEL","SRC"), the line offset is 0
  if (args.size() == 2) {
    // To avoid double counting of line 0 of each entry point,
    // Don't count the lines that do not give an explicit line
    // number.
    routine.clear();
    function.clear();
  } else {
    // this is the format for this line
    // ^COVERAGE("%RSEL","SRC",count)
    linenumber = atoi(args[2].c_str());
  }
  return true;
}